

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

char * nk_dtoa(char *s,double n)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  int local_58;
  int local_54;
  int j;
  int i;
  double t;
  double weight;
  char *pcStack_38;
  int neg;
  char *c;
  int m1;
  int m;
  int digit;
  int useExp;
  double n_local;
  char *s_local;
  
  c._0_4_ = 0;
  if (s != (char *)0x0) {
    if (s == (char *)0x0) {
      s_local = (char *)0x0;
    }
    else {
      s_local = s;
      if ((n != 0.0) || (NAN(n))) {
        bVar2 = n < 0.0;
        _digit = n;
        if (bVar2) {
          _digit = -n;
        }
        c._4_4_ = nk_log10(_digit);
        bVar1 = true;
        if ((c._4_4_ < 0xe) && ((!bVar2 || (bVar1 = true, c._4_4_ < 9)))) {
          bVar1 = c._4_4_ < -8;
        }
        pcStack_38 = s;
        if (bVar2) {
          pcStack_38 = s + 1;
          *s = '-';
        }
        if (bVar1) {
          if (c._4_4_ < 0) {
            c._4_4_ = c._4_4_ + -1;
          }
          dVar4 = nk_pow(10.0,c._4_4_);
          _digit = _digit / dVar4;
          c._0_4_ = c._4_4_;
          c._4_4_ = 0;
        }
        if ((double)c._4_4_ < 1.0) {
          c._4_4_ = 0;
        }
        for (; 1e-14 < _digit || -1 < c._4_4_; c._4_4_ = c._4_4_ + -1) {
          dVar4 = nk_pow(10.0,c._4_4_);
          if (0.0 < dVar4) {
            iVar3 = nk_ifloord(_digit / dVar4);
            _digit = -(double)iVar3 * dVar4 + _digit;
            *pcStack_38 = (char)iVar3 + '0';
            pcStack_38 = pcStack_38 + 1;
          }
          if ((c._4_4_ == 0) && (0.0 < _digit)) {
            *pcStack_38 = '.';
            pcStack_38 = pcStack_38 + 1;
          }
        }
        if (bVar1) {
          *pcStack_38 = 'e';
          if ((int)c < 1) {
            pcStack_38[1] = '-';
            c._0_4_ = -(int)c;
          }
          else {
            pcStack_38[1] = '+';
          }
          pcStack_38 = pcStack_38 + 2;
          c._4_4_ = 0;
          for (; 0 < (int)c; c._0_4_ = (int)c / 10) {
            *pcStack_38 = (char)((int)c % 10) + '0';
            c._4_4_ = c._4_4_ + 1;
            pcStack_38 = pcStack_38 + 1;
          }
          local_58 = c._4_4_;
          for (local_54 = 0; local_58 = local_58 + -1, local_54 < local_58; local_54 = local_54 + 1)
          {
            pcStack_38[(long)local_54 - (long)c._4_4_] =
                 pcStack_38[(long)local_54 - (long)c._4_4_] ^
                 pcStack_38[(long)local_58 - (long)c._4_4_];
            pcStack_38[(long)local_58 - (long)c._4_4_] =
                 pcStack_38[(long)local_58 - (long)c._4_4_] ^
                 pcStack_38[(long)local_54 - (long)c._4_4_];
            pcStack_38[(long)local_54 - (long)c._4_4_] =
                 pcStack_38[(long)local_54 - (long)c._4_4_] ^
                 pcStack_38[(long)local_58 - (long)c._4_4_];
          }
          pcStack_38 = pcStack_38 + ((long)c._4_4_ - (long)c._4_4_);
        }
        *pcStack_38 = '\0';
      }
      else {
        *s = '0';
        s[1] = '\0';
      }
    }
    return s_local;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x141e,"char *nk_dtoa(char *, double)");
}

Assistant:

NK_INTERN char*
nk_dtoa(char *s, double n)
{
    int useExp = 0;
    int digit = 0, m = 0, m1 = 0;
    char *c = s;
    int neg = 0;

    NK_ASSERT(s);
    if (!s) return 0;

    if (n == 0.0) {
        s[0] = '0'; s[1] = '\0';
        return s;
    }

    neg = (n < 0);
    if (neg) n = -n;

    /* calculate magnitude */
    m = nk_log10(n);
    useExp = (m >= 14 || (neg && m >= 9) || m <= -9);
    if (neg) *(c++) = '-';

    /* set up for scientific notation */
    if (useExp) {
        if (m < 0)
           m -= 1;
        n = n / (double)nk_pow(10.0, m);
        m1 = m;
        m = 0;
    }
    if (m < 1.0) {
        m = 0;
    }

    /* convert the number */
    while (n > NK_FLOAT_PRECISION || m >= 0) {
        double weight = nk_pow(10.0, m);
        if (weight > 0) {
            double t = (double)n / weight;
            digit = nk_ifloord(t);
            n -= ((double)digit * weight);
            *(c++) = (char)('0' + (char)digit);
        }
        if (m == 0 && n > 0)
            *(c++) = '.';
        m--;
    }

    if (useExp) {
        /* convert the exponent */
        int i, j;
        *(c++) = 'e';
        if (m1 > 0) {
            *(c++) = '+';
        } else {
            *(c++) = '-';
            m1 = -m1;
        }
        m = 0;
        while (m1 > 0) {
            *(c++) = (char)('0' + (char)(m1 % 10));
            m1 /= 10;
            m++;
        }
        c -= m;
        for (i = 0, j = m-1; i<j; i++, j--) {
            /* swap without temporary */
            c[i] ^= c[j];
            c[j] ^= c[i];
            c[i] ^= c[j];
        }
        c += m;
    }
    *(c) = '\0';
    return s;
}